

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O0

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* Kumu::km_token_split
            (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,string *separator)

{
  undefined8 uVar1;
  char *pcVar2;
  long lVar3;
  allocator<char> local_89;
  value_type local_88;
  undefined1 local_58 [8];
  string tmp_str;
  char *r;
  char *pstr;
  string *separator_local;
  string *str_local;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *components;
  
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(__return_storage_ptr__);
  r = (char *)std::__cxx11::string::c_str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  tmp_str.field_2._8_8_ = strstr(r,pcVar2);
  while( true ) {
    if (tmp_str.field_2._8_8_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,r,&local_89);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
      return __return_storage_ptr__;
    }
    if ((ulong)tmp_str.field_2._8_8_ < r) break;
    std::__cxx11::string::string((string *)local_58);
    std::__cxx11::string::assign((char *)local_58,(ulong)r);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_58);
    uVar1 = tmp_str.field_2._8_8_;
    lVar3 = std::__cxx11::string::size();
    r = (char *)(uVar1 + lVar3);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    tmp_str.field_2._8_8_ = strstr(r,pcVar2);
    std::__cxx11::string::~string((string *)local_58);
  }
  __assert_fail("r >= pstr",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.cpp"
                ,0x4d9,
                "std::list<std::string> Kumu::km_token_split(const std::string &, const std::string &)"
               );
}

Assistant:

std::list<std::string>
Kumu::km_token_split(const std::string& str, const std::string& separator)
{
  std::list<std::string> components;
  const char* pstr = str.c_str();
  const char* r = strstr(pstr, separator.c_str());

  while ( r != 0 )
    {
      assert(r >= pstr);
      std::string tmp_str;
      tmp_str.assign(pstr, r - pstr);
      components.push_back(tmp_str);
      pstr = r + separator.size();
      r = strstr(pstr, separator.c_str());
    }
      
  components.push_back(std::string(pstr));
  return components;
}